

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::OnDelegate(TypeChecker *this,Index depth)

{
  LabelType LVar1;
  Type *pTVar2;
  Result RVar3;
  Result RVar4;
  Enum EVar5;
  Label *__p;
  Type *pTVar6;
  Label *try_label;
  Label *label;
  Label *local_40;
  Label *local_38;
  
  RVar3 = GetLabel(this,depth + 1,&local_38);
  EVar5 = Error;
  if (RVar3.enum_ != Error) {
    RVar3 = GetLabel(this,0,&local_40);
    EVar5 = Error;
    if (RVar3.enum_ != Error) {
      LVar1 = local_40->label_type;
      RVar3 = PopAndCheckSignature(this,&local_40->result_types,"try block");
      RVar4 = CheckTypeStackEnd(this,"try block");
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::resize
                (&this->type_stack_,local_40->type_stack_limit);
      pTVar2 = (local_40->result_types).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pTVar6 = (local_40->result_types).
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start; pTVar6 != pTVar2; pTVar6 = pTVar6 + 1) {
        PushType(this,*pTVar6);
      }
      EVar5 = (Enum)((RVar4.enum_ == Error || RVar3.enum_ == Error) || LVar1 != Try);
      __p = (this->label_stack_).
            super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>.
            _M_impl.super__Vector_impl_data._M_finish + -1;
      (this->label_stack_).
      super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>.
      _M_impl.super__Vector_impl_data._M_finish = __p;
      __gnu_cxx::new_allocator<wabt::TypeChecker::Label>::destroy<wabt::TypeChecker::Label>
                ((new_allocator<wabt::TypeChecker::Label> *)&this->label_stack_,__p);
    }
  }
  return (Result)EVar5;
}

Assistant:

Result TypeChecker::OnDelegate(Index depth) {
  Result result = Result::Ok;
  Label* label;
  // Delegate starts counting after the current try, as the delegate
  // instruction is not actually in the try block.
  CHECK_RESULT(GetLabel(depth + 1, &label));

  Label* try_label;
  CHECK_RESULT(TopLabel(&try_label));
  result |= CheckLabelType(try_label, LabelType::Try);
  result |= PopAndCheckSignature(try_label->result_types, "try block");
  result |= CheckTypeStackEnd("try block");
  ResetTypeStackToLabel(try_label);

  // Since an end instruction does not follow a delegate, we push
  // the block results here and pop the label.
  PushTypes(try_label->result_types);
  PopLabel();
  return result;
}